

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::Consume(ParserImpl *this,string *value)

{
  bool bVar1;
  Token *pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *current_value;
  string *value_local;
  ParserImpl *this_local;
  
  current_value = value;
  value_local = (string *)this;
  pTVar2 = io::Tokenizer::current(&this->tokenizer_);
  local_28 = &pTVar2->text;
  bVar1 = std::operator!=(local_28,current_value);
  if (bVar1) {
    std::operator+(&local_a8,"Expected \"",current_value);
    std::operator+(&local_88,&local_a8,"\", found \"");
    std::operator+(&local_68,&local_88,local_28);
    std::operator+(&local_48,&local_68,"\".");
    ReportError(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  else {
    io::Tokenizer::Next(&this->tokenizer_);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool Consume(const string& value) {
    const string& current_value = tokenizer_.current().text;

    if (current_value != value) {
      ReportError("Expected \"" + value + "\", found \"" + current_value
                  + "\".");
      return false;
    }

    tokenizer_.Next();

    return true;
  }